

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  lua_CFunction p_Var1;
  lua_CFunction p_Var2;
  TValue *pTVar3;
  UpVal *uv;
  long lVar4;
  
  pTVar3 = index2addr(L,fidx1);
  p_Var1 = (pTVar3->value_).f;
  lVar4 = (long)n1;
  pTVar3 = index2addr(L,fidx2);
  p_Var2 = (pTVar3->value_).f;
  luaC_upvdeccount(L,*(UpVal **)(p_Var1 + lVar4 * 8 + 0x18));
  uv = *(UpVal **)(p_Var2 + (long)n2 * 8 + 0x18);
  *(UpVal **)(p_Var1 + lVar4 * 8 + 0x18) = uv;
  uv->refcount = uv->refcount + 1;
  pTVar3 = uv->v;
  if (pTVar3 != (TValue *)&uv->u) {
    (uv->u).open.touched = 1;
    uv = *(UpVal **)(p_Var1 + (lVar4 + -1) * 8 + 0x20);
    pTVar3 = uv->v;
  }
  if (((pTVar3->tt_ & 0x40) != 0) && (pTVar3 == (TValue *)&uv->u)) {
    luaC_upvalbarrier_(L,uv);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin(lua_State *L, int fidx1, int n1,
                             int fidx2, int n2) {
    LClosure *f1;
    UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
    UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
    luaC_upvdeccount(L, *up1);
    *up1 = *up2;
    (*up1)->refcount++;
    if (upisopen(*up1)) (*up1)->u.open.touched = 1;
    luaC_upvalbarrier(L, *up1);
}